

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  vector<double,_std::allocator<double>_> numbers;
  string in;
  vector<double,_std::allocator<double>_> local_48;
  string local_30;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  prompt_filename_abi_cxx11_(&local_30,(FileType *)&local_48);
  read_numbers(&local_48,&local_30);
  print_numbers(&local_48);
  pvVar1 = (void *)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		print_numbers(numbers);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}